

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O0

conspage * next_conspage(void)

{
  LispPTR LVar1;
  conspage *base;
  conspage *base_00;
  LispPTR local_30;
  LispPTR local_2c;
  LispPTR prior;
  LispPTR next;
  conspage *priorpg;
  conspage *pg;
  conspage *page2;
  conspage *page1;
  
  base = (conspage *)alloc_mdspage(5);
  base_00 = base + 0x20;
  init_conspage(base_00,0);
  LVar1 = LPageFromNative(base_00);
  init_conspage(base,LVar1);
  _prior = (conspage *)0x0;
  local_30 = 0;
  local_2c = ListpDTD->dtd_nextpage;
  priorpg = (conspage *)NativeAligned4FromLPage(local_2c);
  while (local_2c != 0 && local_2c != 0xffffffff) {
    _prior = priorpg;
    local_30 = local_2c;
    local_2c = priorpg->next_page;
    priorpg = (conspage *)NativeAligned4FromLPage(local_2c);
  }
  if (local_30 == 0) {
    LVar1 = LPageFromNative(base);
    ListpDTD->dtd_nextpage = LVar1;
  }
  else {
    LVar1 = LPageFromNative(base);
    _prior->next_page = LVar1;
  }
  if (base[0x20].next_page != 0) {
    error("page2 has a next page??");
  }
  if (base_00 == _prior) {
    error("loop in conspage next_pages");
  }
  return base;
}

Assistant:

struct conspage *next_conspage(void) {
  struct conspage *page1; /* Allocated 1st MDS page */
  struct conspage *page2; /* Allocated 2nd MDS page */
  struct conspage *pg, *priorpg;
  LispPTR next, prior;

#ifdef NEWCDRCODING
  /* Allocate 2 conspages and get 1st page base */
  page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);
  /* Calculate next conspage's base address */
  page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

  init_conspage(page2, 0); /* No next page */
  init_conspage(page1, LPageFromNative(page2));

  priorpg = NULL;
  prior = 0;
  for (pg = (struct conspage *)NativeAligned4FromLPage(next = ListpDTD->dtd_nextpage);
       next && (next != CONSPAGE_LAST);
       pg = (struct conspage *)NativeAligned4FromLPage(next = pg->next_page)) {
    priorpg = pg;
    prior = next;
  }

  if (prior)
    priorpg->next_page = LPageFromNative(page1);
  else
    ListpDTD->dtd_nextpage = LPageFromNative(page1);

  if (page2->next_page) error("page2 has a next page??");
  if (page2 == priorpg) error("loop in conspage next_pages");
#else
  for (next = (int)ListpDTD->dtd_nextpage; /* /!\ Note no exit condition /!\ */ /* get next free conspage */
       ; ListpDTD->dtd_nextpage = next = page1->next_page, page1->next_page = 0xffff) {
    if (next == 0) {
      /* Allocate 2 conspages and get 1st page base */
      page1 = (struct conspage *)alloc_mdspage(TYPE_LISTP);

      /* Calculate next conspage's base address */
      page2 = (struct conspage *)((DLword *)page1 + DLWORDSPER_PAGE);

      /* XXX: why is the link for page2's next here?
       * when it was previously commented as "Doesn't exist next page"
       */
      init_conspage(page2, ListpDTD->dtd_nextpage);
      init_conspage(page1, LPageFromNative(page2));

      ListpDTD->dtd_nextpage = LPageFromNative(page1);
      goto ex; /* replaced break */
    } else {
      page1 = (struct conspage *)NativeAligned4FromLPage(next); /*Jan-21*/
    }

    if (page1->count > 1) break;

  } /* for loop end */
#endif /* NEWCDRCODING */
ex:
  return (page1);
}